

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::scaleModel(HModel *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer pdVar11;
  double dVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  int col;
  ulong uVar18;
  int iCol_1;
  int iCol_2;
  int iRow;
  int search_count;
  int iVar19;
  int iRow_1;
  double dVar20;
  double dVar21;
  double dVar22;
  double inf;
  vector<double,_std::allocator<double>_> rowMin;
  vector<double,_std::allocator<double>_> rowMax;
  allocator_type local_79;
  double local_78;
  value_type_conflict1 local_70;
  value_type_conflict1 local_68;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  if (this->intOption[2] != 0) {
    this_00 = &this->colScale;
    local_60._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (this_00,(long)this->numCol,(value_type_conflict1 *)&local_60);
    this_01 = &this->rowScale;
    local_60._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (this_01,(long)this->numRow,(value_type_conflict1 *)&local_60);
    local_68 = 1e+200;
    uVar1 = this->numCol;
    uVar2 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)uVar1];
    uVar14 = 0;
    uVar15 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar15 = uVar14;
    }
    dVar21 = 1e+200;
    dVar20 = 0.0;
    for (; uVar15 != uVar14; uVar14 = uVar14 + 1) {
      dVar22 = ABS((this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar14]);
      dVar12 = dVar22;
      if (dVar21 <= dVar22) {
        dVar12 = dVar21;
      }
      dVar21 = dVar12;
      if (dVar22 <= dVar20) {
        dVar22 = dVar20;
      }
      dVar20 = dVar22;
    }
    if ((dVar21 < 0.2) || (5.0 < dVar20)) {
      uVar15 = 0;
      uVar14 = 0;
      if (0 < (int)uVar1) {
        uVar14 = (ulong)uVar1;
      }
      local_78 = 1e+200;
      for (; uVar14 != uVar15; uVar15 = uVar15 + 1) {
        dVar20 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar15] * (double)this->objSense;
        if (((dVar20 != 0.0) || (dVar21 = local_78, NAN(dVar20))) &&
           (dVar21 = ABS(dVar20), local_78 <= ABS(dVar20))) {
          dVar21 = local_78;
        }
        local_78 = dVar21;
      }
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_60,(long)this->numRow,&local_68,
                 (allocator_type *)&local_48);
      local_70 = 1e-200;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_48,(long)this->numRow,&local_70,
                 &local_79);
      for (iVar19 = 0; iVar19 != 6; iVar19 = iVar19 + 1) {
        lVar13 = 0;
        while (lVar17 = lVar13, lVar17 < this->numCol) {
          dVar20 = 1e+200;
          dVar21 = 1e-200;
          if (local_78 < 0.1) {
            dVar22 = (double)this->objSense *
                     (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar17];
            dVar20 = 1e+200;
            dVar21 = 1e-200;
            if ((dVar22 != 0.0) || (NAN(dVar22))) {
              dVar21 = ABS(dVar22);
              dVar20 = dVar21;
              if (1e+200 <= dVar21) {
                dVar20 = 1e+200;
              }
              if (dVar21 <= 1e-200) {
                dVar21 = 1e-200;
              }
            }
          }
          piVar5 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (lVar13 = (long)piVar5[lVar17]; lVar13 < piVar5[lVar17 + 1]; lVar13 = lVar13 + 1) {
            dVar22 = ABS((this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar13]) *
                     (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start
                     [(this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar13]];
            dVar12 = dVar22;
            if (dVar20 <= dVar22) {
              dVar12 = dVar20;
            }
            dVar20 = dVar12;
            if (dVar22 <= dVar21) {
              dVar22 = dVar21;
            }
            dVar21 = dVar22;
          }
          dVar20 = dVar20 * dVar21;
          if (dVar20 < 0.0) {
            dVar20 = sqrt(dVar20);
          }
          else {
            dVar20 = SQRT(dVar20);
          }
          pdVar6 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar6[lVar17] = 1.0 / dVar20;
          piVar5 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar7 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar3 = piVar5[lVar17 + 1];
          pdVar8 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (lVar16 = (long)piVar5[lVar17]; lVar13 = lVar17 + 1, lVar16 < iVar3;
              lVar16 = lVar16 + 1) {
            iVar4 = piVar7[lVar16];
            dVar20 = ABS(pdVar8[lVar16]) * pdVar6[lVar17];
            dVar21 = dVar20;
            if (local_60._M_impl.super__Vector_impl_data._M_start[iVar4] <= dVar20) {
              dVar21 = local_60._M_impl.super__Vector_impl_data._M_start[iVar4];
            }
            local_60._M_impl.super__Vector_impl_data._M_start[iVar4] = dVar21;
            if (dVar20 <= local_48._M_impl.super__Vector_impl_data._M_start[iVar4]) {
              dVar20 = local_48._M_impl.super__Vector_impl_data._M_start[iVar4];
            }
            local_48._M_impl.super__Vector_impl_data._M_start[iVar4] = dVar20;
          }
        }
        for (lVar13 = 0; lVar13 < this->numRow; lVar13 = lVar13 + 1) {
          dVar20 = local_60._M_impl.super__Vector_impl_data._M_start[lVar13] *
                   local_48._M_impl.super__Vector_impl_data._M_start[lVar13];
          if (dVar20 < 0.0) {
            dVar20 = sqrt(dVar20);
          }
          else {
            dVar20 = SQRT(dVar20);
          }
          (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar13] = 1.0 / dVar20;
        }
        std::vector<double,_std::allocator<double>_>::_M_fill_assign
                  ((vector<double,_std::allocator<double>_> *)&local_60,(long)this->numRow,&local_68
                  );
        local_70 = 1e-200;
        std::vector<double,_std::allocator<double>_>::_M_fill_assign
                  ((vector<double,_std::allocator<double>_> *)&local_48,(long)this->numRow,&local_70
                  );
      }
      for (lVar13 = 0; lVar13 < this->numCol; lVar13 = lVar13 + 1) {
        dVar20 = log((this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar13]);
        dVar20 = floor(dVar20 / 0.6931471805599453 + 0.5);
        dVar20 = exp2(dVar20);
        (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar13] = dVar20;
      }
      for (lVar13 = 0; uVar1 = this->numRow, lVar13 < (int)uVar1; lVar13 = lVar13 + 1) {
        dVar20 = log((this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar13]);
        dVar20 = floor(dVar20 / 0.6931471805599453 + 0.5);
        dVar20 = exp2(dVar20);
        (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar13] = dVar20;
      }
      piVar5 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar14 = 0;
      uVar15 = (ulong)(uint)this->numCol;
      if (this->numCol < 1) {
        uVar15 = uVar14;
      }
      while (uVar18 = uVar14, uVar18 != uVar15) {
        iVar19 = piVar5[uVar18 + 1];
        pdVar6 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar8 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar9 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar13 = (long)piVar5[uVar18]; uVar14 = uVar18 + 1, lVar13 < iVar19;
            lVar13 = lVar13 + 1) {
          pdVar8[lVar13] = pdVar6[uVar18] * pdVar9[piVar7[lVar13]] * pdVar8[lVar13];
        }
      }
      pdVar6 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar10 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
        dVar20 = pdVar8[uVar14];
        dVar21 = 1.0;
        if ((dVar20 != -1e+200) || (NAN(dVar20))) {
          dVar21 = pdVar9[uVar14];
        }
        pdVar8[uVar14] = dVar20 / dVar21;
        dVar20 = pdVar10[uVar14];
        dVar21 = 1.0;
        if ((dVar20 != 1e+200) || (NAN(dVar20))) {
          dVar21 = pdVar9[uVar14];
        }
        pdVar10[uVar14] = dVar20 / dVar21;
        pdVar6[uVar14] = pdVar9[uVar14] * pdVar6[uVar14];
      }
      pdVar6 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar18 = 0;
      uVar14 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar14 = uVar18;
      }
      for (; uVar14 != uVar18; uVar18 = uVar18 + 1) {
        dVar20 = pdVar6[uVar18];
        dVar21 = 1.0;
        if ((dVar20 != -1e+200) || (NAN(dVar20))) {
          dVar21 = pdVar9[uVar18];
        }
        pdVar6[uVar18] = dVar20 * dVar21;
        dVar20 = pdVar8[uVar18];
        dVar21 = 1.0;
        if ((dVar20 != 1e+200) || (NAN(dVar20))) {
          dVar21 = pdVar9[uVar18];
        }
        pdVar8[uVar18] = dVar20 * dVar21;
      }
      if (this->impliedBoundsPresolve == true) {
        pdVar6 = (this->primalColLowerImplied).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar8 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar9 = (this->primalColUpperImplied).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar10 = (this->dualColLowerImplied).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar11 = (this->dualColUpperImplied).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        for (uVar18 = 0; uVar15 != uVar18; uVar18 = uVar18 + 1) {
          dVar20 = pdVar6[uVar18];
          dVar21 = 1.0;
          if ((dVar20 != -1e+200) || (NAN(dVar20))) {
            dVar21 = pdVar8[uVar18];
          }
          pdVar6[uVar18] = dVar20 / dVar21;
          dVar20 = pdVar9[uVar18];
          dVar21 = 1.0;
          if ((dVar20 != 1e+200) || (NAN(dVar20))) {
            dVar21 = pdVar8[uVar18];
          }
          pdVar9[uVar18] = dVar20 / dVar21;
          dVar20 = pdVar10[uVar18];
          dVar21 = 1.0;
          if ((dVar20 != -1e+200) || (NAN(dVar20))) {
            dVar21 = pdVar8[uVar18];
          }
          pdVar10[uVar18] = dVar20 * dVar21;
          dVar20 = pdVar11[uVar18];
          dVar21 = 1.0;
          if ((dVar20 != 1e+200) || (NAN(dVar20))) {
            dVar21 = pdVar8[uVar18];
          }
          pdVar11[uVar18] = dVar20 * dVar21;
        }
        pdVar6 = (this->primalRowLowerImplied).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar8 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar9 = (this->primalRowUpperImplied).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar10 = (this->dualRowLowerImplied).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar11 = (this->dualRowUpperImplied).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        for (uVar18 = 0; uVar14 != uVar18; uVar18 = uVar18 + 1) {
          dVar20 = pdVar6[uVar18];
          dVar21 = 1.0;
          if ((dVar20 != -1e+200) || (NAN(dVar20))) {
            dVar21 = pdVar8[uVar18];
          }
          pdVar6[uVar18] = dVar20 * dVar21;
          dVar20 = pdVar9[uVar18];
          dVar21 = 1.0;
          if ((dVar20 != 1e+200) || (NAN(dVar20))) {
            dVar21 = pdVar8[uVar18];
          }
          pdVar9[uVar18] = dVar20 * dVar21;
          dVar20 = pdVar10[uVar18];
          dVar21 = 1.0;
          if ((dVar20 != -1e+200) || (NAN(dVar20))) {
            dVar21 = pdVar8[uVar18];
          }
          pdVar10[uVar18] = dVar20 / dVar21;
          dVar20 = pdVar11[uVar18];
          dVar21 = 1.0;
          if ((dVar20 != 1e+200) || (NAN(dVar20))) {
            dVar21 = pdVar8[uVar18];
          }
          pdVar11[uVar18] = dVar20 / dVar21;
        }
      }
      if (this->mlFg_haveSavedBounds != 0) {
        pdVar6 = (this->SvColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar8 = (this->colScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar9 = (this->SvColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar18 = 0; uVar15 != uVar18; uVar18 = uVar18 + 1) {
          dVar20 = pdVar6[uVar18];
          if (-1e+200 < dVar20) {
            pdVar6[uVar18] = dVar20 * pdVar8[uVar18];
          }
          dVar20 = pdVar9[uVar18];
          if (dVar20 < 1e+200) {
            pdVar9[uVar18] = dVar20 * pdVar8[uVar18];
          }
        }
        pdVar6 = (this->SvRowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar8 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar9 = (this->SvRowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
          dVar20 = pdVar6[uVar15];
          if (-1e+200 < dVar20) {
            pdVar6[uVar15] = dVar20 * pdVar8[uVar15];
          }
          dVar20 = pdVar9[uVar15];
          if (dVar20 < 1e+200) {
            pdVar9[uVar15] = dVar20 * pdVar8[uVar15];
          }
        }
      }
      mlFg_Update(this,this->mlFg_action_ScaleLP);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
    }
  }
  return;
}

Assistant:

void HModel::scaleModel() {
  if (intOption[INTOPT_SCALE_FLAG] == 0) {
    //    printf("NOT SCALING MATRIX\n");
    return;}
  
  // Reset all scaling to 1
  colScale.assign(numCol, 1);
  rowScale.assign(numRow, 1);

    // Find out min0 / max0, skip on if in [0.2, 5]
    const double inf = HSOL_CONST_INF;
    double min0 = inf, max0 = 0;
    for (int k = 0, AnX = Astart[numCol]; k < AnX; k++) {
        double value = fabs(Avalue[k]);
        min0 = min(min0, value);
        max0 = max(max0, value);
    }
    if (min0 >= 0.2 && max0 <= 5)
        return;

    // See if we want to include cost include if min-cost < 0.1
    double minc = inf;
    for (int i = 0; i < numCol; i++) {
      double sense_col_cost = objSense*colCost[i];
      if (sense_col_cost)
	minc = min(minc, fabs(sense_col_cost));
    }
    bool doCost = minc < 0.1;

    // Search up to 6 times
    vector<double> rowMin(numRow, inf);
    vector<double> rowMax(numRow, 1 / inf);
    for (int search_count = 0; search_count < 6; search_count++) {
        // Find column scale, prepare row data
        for (int iCol = 0; iCol < numCol; iCol++) {
            // For column scale (find)
            double colMin = inf;
            double colMax = 1 / inf;
	    double sense_col_cost = objSense*colCost[iCol];
            double myCost = fabs(sense_col_cost);
            if (doCost && myCost != 0)
                colMin = min(colMin, myCost), colMax = max(colMax, myCost);
            for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
                double value = fabs(Avalue[k]) * rowScale[Aindex[k]];
                colMin = min(colMin, value), colMax = max(colMax, value);
            }
            colScale[iCol] = 1 / sqrt(colMin * colMax);

            // For row scale (only collect)
            for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
                int iRow = Aindex[k];
                double value = fabs(Avalue[k]) * colScale[iCol];
                rowMin[iRow] = min(rowMin[iRow], value);
                rowMax[iRow] = max(rowMax[iRow], value);
            }
        }

        // For row scale (find)
        for (int iRow = 0; iRow < numRow; iRow++)
            rowScale[iRow] = 1 / sqrt(rowMin[iRow] * rowMax[iRow]);
        rowMin.assign(numRow, inf);
        rowMax.assign(numRow, 1 / inf);
    }

    // Make it numerical better
    const double ln2 = log(2.0);
    for (int iCol = 0; iCol < numCol; iCol++)
        colScale[iCol] = pow(2.0, floor(log(colScale[iCol]) / ln2 + 0.5));
    for (int iRow = 0; iRow < numRow; iRow++)
        rowScale[iRow] = pow(2.0, floor(log(rowScale[iRow]) / ln2 + 0.5));

    // Apply scaling to matrix and bounds
    for (int iCol = 0; iCol < numCol; iCol++)
        for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++)
            Avalue[k] *= (colScale[iCol] * rowScale[Aindex[k]]);

    for (int iCol = 0; iCol < numCol; iCol++) {
        colLower[iCol] /= colLower[iCol] == -inf ? 1 : colScale[iCol];
        colUpper[iCol] /= colUpper[iCol] == +inf ? 1 : colScale[iCol];
        colCost[iCol] *= colScale[iCol];
    }
    for (int iRow = 0; iRow < numRow; iRow++) {
        rowLower[iRow] *= rowLower[iRow] == -inf ? 1 : rowScale[iRow];
        rowUpper[iRow] *= rowUpper[iRow] == +inf ? 1 : rowScale[iRow];
    }
	if (impliedBoundsPresolve) {
		for (int iCol = 0; iCol < numCol; iCol++) {
			primalColLowerImplied[iCol] /= primalColLowerImplied[iCol] == -inf ? 1 : colScale[iCol];
			primalColUpperImplied[iCol] /= primalColUpperImplied[iCol] == +inf ? 1 : colScale[iCol];
			dualColLowerImplied[iCol] *= dualColLowerImplied[iCol] == -inf ? 1 : colScale[iCol];
			dualColUpperImplied[iCol] *= dualColUpperImplied[iCol] == +inf ? 1 : colScale[iCol];
		}
		for (int iRow = 0; iRow < numRow; iRow++) {
			primalRowLowerImplied[iRow] *= primalRowLowerImplied[iRow] == -inf ? 1 : rowScale[iRow];
			primalRowUpperImplied[iRow] *= primalRowUpperImplied[iRow] == +inf ? 1 : rowScale[iRow];
			dualRowLowerImplied[iRow] /= dualRowLowerImplied[iRow] == -inf ? 1 : rowScale[iRow];
			dualRowUpperImplied[iRow] /= dualRowUpperImplied[iRow] == +inf ? 1 : rowScale[iRow];
		}
	}

	if (mlFg_haveSavedBounds) {
	  //Model has saved bounds which must also be scaled so they are consistent when recovered
	  for (int col = 0; col < numCol; col++) {
	    if (!hsol_isInfinity(-SvColLower[col])) SvColLower[col] *= colScale[col];
	    if (!hsol_isInfinity( SvColUpper[col])) SvColUpper[col] *= colScale[col];
	  }
	  for (int row = 0; row < numRow; row++) {
	    if (!hsol_isInfinity(-SvRowLower[row])) SvRowLower[row] *= rowScale[row];
	    if (!hsol_isInfinity( SvRowUpper[row])) SvRowUpper[row] *= rowScale[row];
	  }
	}
    //Deduce the consequences of scaling the LP
    mlFg_Update(mlFg_action_ScaleLP);
}